

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O1

QByteArray *
qdtoAscii(QByteArray *__return_storage_ptr__,double d,DoubleForm form,int precision,bool uppercase)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QArrayData *data;
  DoubleForm DVar3;
  uint uVar4;
  uint uVar5;
  size_t __size;
  long lVar6;
  iterator pcVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  qsizetype qVar12;
  byte *pbVar13;
  uint uVar14;
  DoubleForm DVar15;
  size_t allocSize;
  size_t allocSize_00;
  long in_FS_OFFSET;
  bool bVar16;
  ulong uVar17;
  QByteArrayView data_00;
  QByteArrayView data_01;
  QByteArrayView data_02;
  QByteArrayView data_03;
  QByteArrayView data_04;
  QByteArrayView data_05;
  QByteArrayView data_06;
  QByteArrayView data_07;
  int decpt;
  int length;
  bool negative;
  QVarLengthArray<char,_323LL> buffer;
  QByteArray local_1c8;
  int local_1a4;
  int local_1a0;
  bool local_199;
  size_t local_198;
  size_t local_190;
  char *local_188;
  char local_180 [328];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar14 = 6;
  if (-1 < precision) {
    uVar14 = precision;
  }
  if (precision == -0x80) {
    uVar14 = precision;
  }
  iVar9 = 0x12;
  if (uVar14 != 0xffffff80) {
    if ((ulong)ABS(d) < 0x7ff0000000000000 && form == DFDecimal) {
      uVar17 = -(ulong)(d < -d);
      iVar9 = uVar14 + 0x136;
      if ((double)(~uVar17 & (ulong)d | (ulong)-d & uVar17) <= 524288.0) {
        iVar9 = uVar14 + 7;
      }
    }
    else {
      uVar5 = 2;
      if (2 < (int)uVar14) {
        uVar5 = uVar14;
      }
      iVar9 = uVar5 + 2;
    }
  }
  memset(&local_198,0xaa,0x160);
  allocSize_00 = (size_t)iVar9;
  local_198 = 0x143;
  local_190 = 0;
  local_188 = local_180;
  if (0x143 < iVar9) {
    local_198 = allocSize_00;
    __size = QtPrivate::expectedAllocSize(allocSize_00,0x10);
    if (__size == 0) {
      __size = allocSize_00;
    }
    local_188 = (char *)malloc(__size);
    local_198 = __size;
    if (local_188 == (char *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_00325b88;
    }
  }
  local_199 = false;
  local_1a0 = 0;
  local_1a4 = 0;
  local_190 = allocSize_00;
  qt_doubleToAscii(d,form,uVar14,local_188,allocSize_00,&local_199,&local_1a0,&local_1a4);
  pcVar11 = local_188;
  iVar9 = local_1a0;
  lVar6 = (long)local_1a0;
  lVar10 = (ulong)local_199 + lVar6;
  DVar3 = form;
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    if (form == DFSignificantDigits) {
      DVar3 = resolveFormat(uVar14,local_1a4,lVar6);
    }
    if (DVar3 == DFDecimal) {
      if (local_1a4 < 1) {
        uVar17 = (ulong)(2 - local_1a4);
      }
      else {
        uVar17 = 1;
        if (iVar9 <= local_1a4) {
          uVar17 = (ulong)(local_1a4 - iVar9);
        }
      }
      lVar10 = lVar10 + uVar17;
      DVar15 = DFDecimal;
      DVar3 = DFDecimal;
      if (0 < (int)uVar14 && form != DFSignificantDigits) {
        if (local_1a4 < iVar9) {
          uVar4 = (uVar14 - iVar9) + local_1a4;
          uVar5 = 0;
          if (0 < (int)uVar4) {
            uVar5 = uVar4;
          }
          uVar17 = (ulong)uVar5;
          goto LAB_00325642;
        }
        lVar10 = lVar10 + (ulong)uVar14 + 1;
      }
    }
    else if (DVar3 == DFExponent) {
      uVar4 = local_1a4 - 1;
      uVar5 = -uVar4;
      if (0 < (int)uVar4) {
        uVar5 = uVar4;
      }
      if (uVar5 < 1000) {
        uVar4 = 1;
        if (9 < uVar5) {
          uVar4 = 3 - (uVar5 < 100);
        }
      }
      else {
        qdtoAscii();
        uVar4 = (uint)local_1c8.d.d;
      }
      uVar8 = 2;
      if (2 < (int)uVar4) {
        uVar8 = (ulong)uVar4;
      }
      uVar5 = (uVar14 - iVar9) + 1;
      DVar15 = DFExponent;
      uVar17 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar17 = 0;
      }
      if (form == DFSignificantDigits) {
        uVar17 = 0;
      }
      lVar10 = lVar10 + 3 + uVar8;
LAB_00325642:
      lVar10 = lVar10 + uVar17;
      DVar3 = DVar15;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  qVar12 = 0;
  if (0 < lVar10) {
    qVar12 = lVar10;
  }
  QByteArray::reallocData(__return_storage_ptr__,qVar12,KeepSize);
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  if (((d != 0.0) || (NAN(d))) && (local_199 != false)) {
    QByteArray::append(__return_storage_ptr__,'-');
  }
  if ((ulong)ABS(d) < 0x7ff0000000000000) {
    if (DVar3 == DFDecimal) {
      data_06.m_size = (long)local_1a4;
      if (data_06.m_size < 0) {
        data_04.m_data = "0.0";
        data_04.m_size = 3;
        QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_04);
        while (local_1a4 < -1) {
          local_1a4 = local_1a4 + 1;
          QByteArray::append(__return_storage_ptr__,'0');
        }
        data_05.m_data = pcVar11;
        data_05.m_size = lVar6;
        local_1a4 = local_1a4 + 1;
        QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_05);
        if (form != DFSignificantDigits) {
          for (lVar6 = ((__return_storage_ptr__->d).size - (ulong)local_199) + -2;
              lVar6 < (int)uVar14; lVar6 = lVar6 + 1) {
            QByteArray::append(__return_storage_ptr__,'0');
          }
        }
      }
      else {
        if (iVar9 < local_1a4) {
          data_03.m_data = pcVar11;
          data_03.m_size = lVar6;
          QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_03);
          uVar17 = (ulong)local_199;
          lVar6 = 0;
          while ((long)((__return_storage_ptr__->d).size - uVar17) < (long)local_1a4) {
            QByteArray::append(__return_storage_ptr__,'0');
          }
          pcVar11 = (char *)0x0;
        }
        else if (local_1a4 == 0) {
          QByteArray::append(__return_storage_ptr__,'0');
        }
        else {
          data_06.m_data = pcVar11;
          QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_06);
          pcVar11 = pcVar11 + local_1a4;
          lVar6 = lVar6 - local_1a4;
        }
        if ((lVar6 != 0) || ((form != DFSignificantDigits && (0 < (int)uVar14)))) {
          QByteArray::append(__return_storage_ptr__,'.');
          data_07.m_data = pcVar11;
          data_07.m_size = lVar6;
          QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_07);
          if ((form != DFSignificantDigits) &&
             (lVar10 = (int)uVar14 - lVar6, lVar10 != 0 && lVar6 <= (int)uVar14)) {
            do {
              QByteArray::append(__return_storage_ptr__,'0');
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
          }
        }
      }
    }
    else if (DVar3 == DFExponent) {
      data_00.m_data = pcVar11;
      data_00.m_size = 1;
      QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_00);
      lVar6 = lVar6 + -1;
      if (0 < (int)uVar14 && form != DFSignificantDigits || lVar6 != 0) {
        QByteArray::append(__return_storage_ptr__,'.');
        data_01.m_data = pcVar11 + 1;
        data_01.m_size = lVar6;
        QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_01);
        if ((form != DFSignificantDigits) && (lVar6 = (int)uVar14 - lVar6, 0 < lVar6)) {
          do {
            QByteArray::append(__return_storage_ptr__,'0');
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
      }
      iVar9 = local_1a4;
      QByteArray::append(__return_storage_ptr__,!uppercase << 5 | 0x45);
      QByteArray::append(__return_storage_ptr__,(iVar9 < 1) * '\x02' + '+');
      uVar5 = iVar9 - 1;
      uVar14 = -uVar5;
      if (0 < (int)uVar5) {
        uVar14 = uVar5;
      }
      if (uVar14 < 1000) {
        iVar9 = 1;
        if (9 < uVar14) {
          iVar9 = 3 - (uint)(uVar14 < 100);
        }
      }
      else {
        qdtoAscii();
        iVar9 = (uint)local_1c8.d.d;
      }
      if (iVar9 == 1) {
        QByteArray::append(__return_storage_ptr__,'0');
      }
      QByteArray::resize(__return_storage_ptr__,(long)iVar9 + (__return_storage_ptr__->d).size);
      pcVar7 = QByteArray::begin(__return_storage_ptr__);
      pbVar13 = (byte *)(pcVar7 + (__return_storage_ptr__->d).size);
      uVar17 = (ulong)uVar14;
      do {
        pbVar13 = pbVar13 + -1;
        *pbVar13 = (char)uVar17 + (char)(uVar17 / 10) * -10 | 0x30;
        bVar16 = 9 < uVar17;
        uVar17 = uVar17 / 10;
      } while (bVar16);
    }
  }
  else {
    data_02.m_data = pcVar11;
    data_02.m_size = lVar6;
    QByteArray::insert(__return_storage_ptr__,(__return_storage_ptr__->d).size,data_02);
    if (uppercase) {
      QByteArray::toUpper_helper(&local_1c8,__return_storage_ptr__);
      data = &((__return_storage_ptr__->d).d)->super_QArrayData;
      pcVar11 = (__return_storage_ptr__->d).ptr;
      (__return_storage_ptr__->d).d = local_1c8.d.d;
      (__return_storage_ptr__->d).ptr = local_1c8.d.ptr;
      qVar12 = (__return_storage_ptr__->d).size;
      (__return_storage_ptr__->d).size = local_1c8.d.size;
      local_1c8.d.d = (Data *)data;
      local_1c8.d.ptr = pcVar11;
      local_1c8.d.size = qVar12;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,1,0x10);
        }
      }
    }
  }
  if (local_188 != local_180) {
    QtPrivate::sizedFree(local_188,local_198);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00325b88:
  __stack_chk_fail();
}

Assistant:

QByteArray qdtoAscii(double d, QLocaleData::DoubleForm form, int precision, bool uppercase)
{
    return dtoString<QByteArray>(d, form, precision, uppercase);
}